

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O2

void __thiscall anon_unknown.dwarf_4611f9::ImplPosix::SendToken(ImplPosix *this)

{
  int status;
  uv_stream_t *handle;
  long lVar1;
  __weak_ptr<std::function<void(int)>,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  uv_buf_t buf;
  
  if (this->Conn == None) {
    return;
  }
  buf = uv_buf_init(&SendToken::token,1);
  if (this->Conn == FDs) {
    lVar1 = 0x80;
  }
  else {
    if (this->Conn != FIFO) {
      handle = (uv_stream_t *)0x0;
      goto LAB_00212681;
    }
    lVar1 = 0x90;
  }
  handle = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                     ((uv_pipe_ptr *)((long)&(this->super_Impl)._vptr_Impl + lVar1));
LAB_00212681:
  std::__weak_ptr<std::function<void(int)>,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<std::function<void(int)>,void>
            (local_40,&(this->OnWrite).
                       super___shared_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>);
  status = ::cm::uv_write(handle,&buf,1,(weak_ptr<std::function<void_(int)>_> *)local_40);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38);
  if (status != 0) {
    Disconnect(this,status);
  }
  return;
}

Assistant:

void ImplPosix::SendToken()
{
  if (this->Conn == Connection::None) {
    return;
  }

  static char token = '.';

  uv_buf_t const buf = uv_buf_init(&token, sizeof(token));
  int status = cm::uv_write(this->GetWriter(), &buf, 1, this->OnWrite);
  if (status != 0) {
    this->Disconnect(status);
  }
}